

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

qint64 __thiscall
QHttpMultiPartIODevice::readData(QHttpMultiPartIODevice *this,char *data,qint64 maxSize)

{
  size_t sVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference plVar4;
  qint64 qVar5;
  long lVar6;
  size_t *psVar7;
  char *pcVar8;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 lastBoundaryBytesRead;
  qint64 boundaryIndex;
  qint64 dataBytesRead;
  qint64 boundaryBytesRead;
  qint64 partIndex;
  qint64 boundaryCount;
  qint64 index;
  qint64 bytesRead;
  QByteArray finalBoundary;
  QByteArray boundaryData;
  QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]>
  *in_stack_fffffffffffffe58;
  QHttpPartPrivate *in_stack_fffffffffffffe60;
  long lVar9;
  QHttpPartPrivate *in_stack_fffffffffffffea0;
  long in_stack_fffffffffffffec8;
  char *local_e8;
  long local_d8;
  long local_d0;
  qint64 local_b0;
  long local_a8;
  long local_a0;
  QStringBuilder<const_char_(&)[3],_QByteArray_&> local_98;
  QByteArray local_70;
  long local_58;
  long local_50;
  QStringBuilder<const_char_(&)[3],_QByteArray_&> local_48;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = 0;
  local_d8 = 0;
  while( true ) {
    qVar3 = QList<QHttpPart>::size((QList<QHttpPart> *)(in_RDI[2] + 0x78));
    bVar2 = false;
    if (local_d8 < qVar3) {
      lVar9 = in_RDI[3];
      plVar4 = QList<long_long>::at
                         ((QList<long_long> *)in_stack_fffffffffffffe60,
                          (qsizetype)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffec8 = *plVar4;
      QList<QHttpPart>::at
                ((QList<QHttpPart> *)in_stack_fffffffffffffe60,(qsizetype)in_stack_fffffffffffffe58)
      ;
      QSharedDataPointer<QHttpPartPrivate>::operator->
                ((QSharedDataPointer<QHttpPartPrivate> *)0x2e44f0);
      qVar5 = QHttpPartPrivate::size(in_stack_fffffffffffffe60);
      in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 + qVar5;
      qVar3 = QByteArray::size((QByteArray *)(in_RDI[2] + 0x90));
      bVar2 = in_stack_fffffffffffffec8 + qVar3 + 6 <= lVar9;
    }
    if (!bVar2) break;
    local_d8 = local_d8 + 1;
  }
  do {
    bVar2 = false;
    if (local_d0 < in_RDX) {
      qVar3 = QList<QHttpPart>::size((QList<QHttpPart> *)(in_RDI[2] + 0x78));
      bVar2 = local_d8 < qVar3;
    }
    if (!bVar2) {
      if ((local_d0 < in_RDX) &&
         (qVar3 = QList<QHttpPart>::size((QList<QHttpPart> *)(in_RDI[2] + 0x78)), local_d8 == qVar3)
         ) {
        local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_70.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_70.d.size = -0x5555555555555556;
        local_98 = ::operator+((char (*) [3])in_stack_fffffffffffffe60,
                               (QByteArray *)in_stack_fffffffffffffe58);
        ::operator+((QStringBuilder<const_char_(&)[3],_QByteArray_&> *)in_stack_fffffffffffffe60,
                    (char (*) [5])in_stack_fffffffffffffe58);
        ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffe58);
        lVar9 = in_RDI[3];
        qVar3 = QByteArray::size(&local_70);
        lVar6 = (**(code **)(*in_RDI + 0x80))();
        lVar6 = (lVar9 + qVar3) - lVar6;
        qVar3 = QByteArray::size(&local_70);
        local_a0 = qVar3 - lVar6;
        local_a8 = in_RDX - local_d0;
        psVar7 = (size_t *)qMin<long_long>(&local_a0,&local_a8);
        sVar1 = *psVar7;
        pcVar8 = QByteArray::constData((QByteArray *)0x2e4ba7);
        memcpy((void *)(in_RSI + local_d0),pcVar8 + lVar6,sVar1);
        local_d0 = sVar1 + local_d0;
        in_RDI[3] = sVar1 + in_RDI[3];
        QByteArray::~QByteArray((QByteArray *)0x2e4c01);
      }
      local_b0 = local_d0;
      break;
    }
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    local_48 = ::operator+((char (*) [3])in_stack_fffffffffffffe60,
                           (QByteArray *)in_stack_fffffffffffffe58);
    ::operator+((QStringBuilder<const_char_(&)[3],_QByteArray_&> *)in_stack_fffffffffffffe60,
                (char (*) [3])in_stack_fffffffffffffe58);
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]> *
               )in_stack_fffffffffffffe58);
    qVar3 = QByteArray::size(&local_20);
    lVar9 = in_RDI[3];
    plVar4 = QList<long_long>::at
                       ((QList<long_long> *)in_stack_fffffffffffffe60,
                        (qsizetype)in_stack_fffffffffffffe58);
    local_e8 = (char *)(lVar9 - *plVar4);
    if ((long)local_e8 < qVar3) {
      local_50 = qVar3 - (long)local_e8;
      local_58 = in_RDX - local_d0;
      psVar7 = (size_t *)qMin<long_long>(&local_50,&local_58);
      sVar1 = *psVar7;
      in_stack_fffffffffffffea0 = (QHttpPartPrivate *)(in_RSI + local_d0);
      pcVar8 = QByteArray::constData((QByteArray *)0x2e4721);
      memcpy(in_stack_fffffffffffffea0,pcVar8 + (long)local_e8,sVar1);
      local_d0 = sVar1 + local_d0;
      in_RDI[3] = sVar1 + in_RDI[3];
      local_e8 = local_e8 + sVar1;
    }
    if ((local_d0 < in_RDX) && (qVar3 <= (long)local_e8)) {
      pcVar8 = local_e8;
      QList<QHttpPart>::at
                ((QList<QHttpPart> *)in_stack_fffffffffffffe60,(qsizetype)in_stack_fffffffffffffe58)
      ;
      QSharedDataPointer<QHttpPartPrivate>::operator->
                ((QSharedDataPointer<QHttpPartPrivate> *)0x2e47f1);
      qVar5 = QHttpPartPrivate::size(in_stack_fffffffffffffe60);
      if (qVar3 + qVar5 <= (long)pcVar8) goto LAB_002e48d6;
      QList<QHttpPart>::operator[]
                ((QList<QHttpPart> *)in_stack_fffffffffffffe60,(qsizetype)in_stack_fffffffffffffe58)
      ;
      QSharedDataPointer<QHttpPartPrivate>::operator->
                ((QSharedDataPointer<QHttpPartPrivate> *)in_stack_fffffffffffffe60);
      qVar5 = QHttpPartPrivate::readData(in_stack_fffffffffffffea0,pcVar8,in_stack_fffffffffffffec8)
      ;
      if (qVar5 != -1) {
        local_d0 = qVar5 + local_d0;
        in_RDI[3] = qVar5 + in_RDI[3];
        local_e8 = local_e8 + qVar5;
        goto LAB_002e48d6;
      }
      local_b0 = -1;
      bVar2 = true;
    }
    else {
LAB_002e48d6:
      if (local_d0 < in_RDX) {
        QList<QHttpPart>::at
                  ((QList<QHttpPart> *)in_stack_fffffffffffffe60,
                   (qsizetype)in_stack_fffffffffffffe58);
        QSharedDataPointer<QHttpPartPrivate>::operator->
                  ((QSharedDataPointer<QHttpPartPrivate> *)0x2e492b);
        qVar5 = QHttpPartPrivate::size(in_stack_fffffffffffffe60);
        if (qVar3 + qVar5 <= (long)local_e8) {
          if (local_d0 == in_RDX + -1) {
            local_b0 = local_d0;
            bVar2 = true;
            goto LAB_002e49e4;
          }
          *(undefined2 *)(in_RSI + local_d0) = 0xa0d;
          local_d0 = local_d0 + 2;
          in_RDI[3] = in_RDI[3] + 2;
          local_d8 = local_d8 + 1;
        }
      }
      bVar2 = false;
    }
LAB_002e49e4:
    QByteArray::~QByteArray((QByteArray *)0x2e49f1);
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

qint64 QHttpMultiPartIODevice::readData(char *data, qint64 maxSize)
{
    qint64 bytesRead = 0, index = 0;

    // skip the parts we have already read
    while (index < multiPart->parts.size() &&
           readPointer >= partOffsets.at(index) + multiPart->parts.at(index).d->size()
           + multiPart->boundary.size() + 6) // 6 == 2 boundary dashes, \r\n after boundary, \r\n after multipart
        index++;

    // read the data
    while (bytesRead < maxSize && index < multiPart->parts.size()) {

        // check whether we need to read the boundary of the current part
        QByteArray boundaryData = "--" + multiPart->boundary + "\r\n";
        qint64 boundaryCount = boundaryData.size();
        qint64 partIndex = readPointer - partOffsets.at(index);
        if (partIndex < boundaryCount) {
            qint64 boundaryBytesRead = qMin(boundaryCount - partIndex, maxSize - bytesRead);
            memcpy(data + bytesRead, boundaryData.constData() + partIndex, boundaryBytesRead);
            bytesRead += boundaryBytesRead;
            readPointer += boundaryBytesRead;
            partIndex += boundaryBytesRead;
        }

        // check whether we need to read the data of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount && partIndex < boundaryCount + multiPart->parts.at(index).d->size()) {
            qint64 dataBytesRead = multiPart->parts[index].d->readData(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
            partIndex += dataBytesRead;
        }

        // check whether we need to read the ending CRLF of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount + multiPart->parts.at(index).d->size()) {
            if (bytesRead == maxSize - 1)
                return bytesRead;
            memcpy(data + bytesRead, "\r\n", 2);
            bytesRead += 2;
            readPointer += 2;
            index++;
        }
    }
    // check whether we need to return the final boundary
    if (bytesRead < maxSize && index == multiPart->parts.size()) {
        QByteArray finalBoundary = "--" + multiPart->boundary + "--\r\n";
        qint64 boundaryIndex = readPointer + finalBoundary.size() - size();
        qint64 lastBoundaryBytesRead = qMin(finalBoundary.size() - boundaryIndex, maxSize - bytesRead);
        memcpy(data + bytesRead, finalBoundary.constData() + boundaryIndex, lastBoundaryBytesRead);
        bytesRead += lastBoundaryBytesRead;
        readPointer += lastBoundaryBytesRead;
    }
    return bytesRead;
}